

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filters.c
# Opt level: O2

void HorizontalFilter_C(uint8_t *data,int width,int height,int stride,uint8_t *filtered_data)

{
  uint8_t *src;
  long lVar1;
  int iVar2;
  
  *filtered_data = *data;
  PredictLine_C(data + 1,data,filtered_data + 1,width + -1);
  lVar1 = (long)stride;
  for (iVar2 = 1; iVar2 < height; iVar2 = iVar2 + 1) {
    src = data + lVar1;
    PredictLine_C(src,data,filtered_data + lVar1,1);
    PredictLine_C(data + lVar1 + 1,src,filtered_data + lVar1 + 1,width + -1);
    filtered_data = filtered_data + lVar1;
    data = src;
  }
  return;
}

Assistant:

static void HorizontalFilter_C(const uint8_t* WEBP_RESTRICT data,
                               int width, int height, int stride,
                               uint8_t* WEBP_RESTRICT filtered_data) {
  DoHorizontalFilter_C(data, width, height, stride, filtered_data);
}